

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_callback_helper.h
# Opt level: O1

void __thiscall
miniros::
SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
::call(SubscriptionCallbackHelperT<const_miniros::MessageEvent<const_miniros::topic_tools::ShapeShifter>_&,_void>
       *this,SubscriptionCallbackHelperCallParams *params)

{
  Event event;
  MessageEvent<const_miniros::topic_tools::ShapeShifter> MStack_68;
  
  MessageEvent<const_miniros::topic_tools::ShapeShifter>::MessageEvent
            (&MStack_68,&params->event,&this->create_);
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&MStack_68);
    if (MStack_68.create_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*MStack_68.create_.super__Function_base._M_manager)
                ((_Any_data *)&MStack_68.create_,(_Any_data *)&MStack_68.create_,__destroy_functor);
    }
    if (MStack_68.connection_header_.
        super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (MStack_68.connection_header_.
                 super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (MStack_68.message_copy_.
        super___shared_ptr<miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (MStack_68.message_copy_.
                 super___shared_ptr<miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (MStack_68.message_.
        super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (MStack_68.message_.
                 super___shared_ptr<const_miniros::topic_tools::ShapeShifter,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void call(SubscriptionCallbackHelperCallParams& params)
  {
    Event event(params.event, create_);
    callback_(ParameterAdapter<P>::getParameter(event));
  }